

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opl_mus_player.cpp
# Opt level: O2

void __thiscall OPLmusicBlock::ResetChips(OPLmusicBlock *this)

{
  OPLio *pOVar1;
  int iVar2;
  ulong uVar3;
  
  FCriticalSection::Enter(&this->ChipAccess);
  (*((this->super_musicBlock).io)->_vptr_OPLio[3])();
  pOVar1 = (this->super_musicBlock).io;
  uVar3 = 2;
  if (opl_numchips.Value < 2) {
    uVar3 = (ulong)(uint)opl_numchips.Value;
  }
  iVar2 = (*pOVar1->_vptr_OPLio[2])(pOVar1,uVar3,(ulong)this->FullPan,0);
  this->NumChips = iVar2;
  FCriticalSection::Leave(&this->ChipAccess);
  return;
}

Assistant:

void OPLmusicBlock::ResetChips ()
{
	ChipAccess.Enter();
	io->OPLdeinit ();
	NumChips = io->OPLinit(MIN(*opl_numchips, 2), FullPan);
	ChipAccess.Leave();
}